

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_impl.cpp
# Opt level: O2

void ear::dsp::block_convolver_impl::fade_down_and_up
               (Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in,
               Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *down,
               Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *up)

{
  long lVar1;
  Scalar *pSVar2;
  int i;
  long index;
  float fVar3;
  CoeffReturnType CVar4;
  float fVar5;
  
  _assert_impl((in->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_rows.m_value <=
               *(long *)&(down->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                         ).field_0x8,"down is incorrect size");
  _assert_impl((in->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_rows.m_value <=
               *(long *)&(up->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                         ).field_0x8,"up is incorrect size");
  lVar1 = (in->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  fVar3 = (float)lVar1;
  for (index = 0; index < lVar1; index = index + 1) {
    fVar5 = (float)(int)index * (1.0 / fVar3);
    CVar4 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)in,index);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator[]((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)up,index);
    *pSVar2 = CVar4 * fVar5;
    CVar4 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)in,index);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator[]((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)down,index);
    *pSVar2 = CVar4 * (1.0 - fVar5);
    lVar1 = (in->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_rows.m_value;
  }
  return;
}

Assistant:

void fade_down_and_up(const Eigen::Ref<const TDVector> &in,
                            Eigen::Ref<TDVector> down,
                            Eigen::Ref<TDVector> up) {
        ear_assert(in.size() <= down.size(), "down is incorrect size");
        ear_assert(in.size() <= up.size(), "up is incorrect size");

        real_t i_scale = (real_t)1.0 / (real_t)in.size();

        for (int i = 0; i < in.size(); i++) {
          real_t a_v = (real_t)i * i_scale;
          real_t b_v = 1.0f - a_v;
          up[i] = a_v * in[i];
          down[i] = b_v * in[i];
        }
      }